

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void normalizePublicId(XML_Char *publicId)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  XML_Char *p;
  
  pbVar1 = (byte *)publicId;
  pbVar2 = (byte *)publicId;
  do {
    bVar3 = *pbVar2;
    if (bVar3 < 0xd) {
      if (bVar3 == 10) goto LAB_0045aa76;
      if (bVar3 == 0) {
        if ((pbVar1 != (byte *)publicId) && (pbVar1[-1] == 0x20)) {
          pbVar1 = pbVar1 + -1;
        }
        *pbVar1 = 0;
        return;
      }
LAB_0045aa89:
      *pbVar1 = bVar3;
      pbVar1 = pbVar1 + 1;
    }
    else {
      if ((bVar3 != 0x20) && (bVar3 != 0xd)) goto LAB_0045aa89;
LAB_0045aa76:
      if ((pbVar1 != (byte *)publicId) && (bVar3 = 0x20, pbVar1[-1] != 0x20)) goto LAB_0045aa89;
    }
    pbVar2 = pbVar2 + 1;
  } while( true );
}

Assistant:

static void FASTCALL
normalizePublicId(XML_Char *publicId)
{
  XML_Char *p = publicId;
  XML_Char *s;
  for (s = publicId; *s; s++) {
    switch (*s) {
    case 0x20:
    case 0xD:
    case 0xA:
      if (p != publicId && p[-1] != 0x20)
        *p++ = 0x20;
      break;
    default:
      *p++ = *s;
    }
  }
  if (p != publicId && p[-1] == 0x20)
    --p;
  *p = XML_T('\0');
}